

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiGpj.cxx
# Opt level: O0

char * GhsMultiGpj::GetGpjTag(Types gpjType)

{
  char *local_18;
  char *tag;
  Types gpjType_local;
  
  if (gpjType < (CUSTOM_TARGET|LIBRARY)) {
    local_18 = GHS_TAG[gpjType];
  }
  else {
    local_18 = "";
  }
  return local_18;
}

Assistant:

const char* GhsMultiGpj::GetGpjTag(Types gpjType)
{
  char const* tag;
  switch (gpjType) {
    case INTERGRITY_APPLICATION:
    case LIBRARY:
    case PROJECT:
    case PROGRAM:
    case REFERENCE:
    case SUBPROJECT:
    case CUSTOM_TARGET:
      tag = GHS_TAG[gpjType];
      break;
    default:
      tag = "";
  }
  return tag;
}